

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_loop.cpp
# Opt level: O2

void __thiscall
pseudo_loop::compute_VP(pseudo_loop *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  int iVar1;
  pointer pNVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  energy_t eVar8;
  energy_t eVar9;
  uint uVar10;
  energy_t eVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  uint local_88;
  int local_84;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  lVar21 = (long)i;
  iVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21];
  uVar4 = sparse_tree::Bp(tree,i,j);
  uVar5 = sparse_tree::B(tree,i,j);
  uVar6 = sparse_tree::b(tree,i,j);
  uVar7 = sparse_tree::bp(tree,i,j);
  pNVar2 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = (pNVar2[lVar21].parent)->index;
  iVar13 = (pNVar2[j].parent)->index;
  local_84 = 10000000;
  uVar10 = 10000000;
  if ((((0 < iVar12) && ((int)uVar7 < 0)) && (uVar10 = 10000000, -1 < (int)(uVar5 | uVar4))) &&
     (iVar13 < iVar12)) {
    eVar8 = get_WI(this,i + 1,uVar4 - 1);
    eVar9 = get_WI(this,uVar5 + 1,j + -1);
    uVar10 = eVar9 + eVar8;
  }
  if (((iVar12 < iVar13) && ((int)uVar4 < 0)) && ((-1 < (int)(uVar7 | uVar6) && (0 < iVar13)))) {
    eVar8 = get_WI(this,i + 1,uVar6 - 1);
    eVar9 = get_WI(this,uVar7 + 1,j + -1);
    local_84 = eVar9 + eVar8;
  }
  local_88 = 10000000;
  iVar25 = 10000000;
  if (((0 < iVar12) && (iVar25 = 10000000, -1 < (int)(uVar5 | uVar4 | uVar6 | uVar7))) &&
     (0 < iVar13)) {
    eVar8 = get_WI(this,i + 1,uVar4 - 1);
    eVar9 = get_WI(this,uVar5 + 1,uVar6 - 1);
    eVar11 = get_WI(this,uVar7 + 1,j + -1);
    iVar25 = eVar9 + eVar8 + eVar11;
  }
  iVar12 = i + 1;
  lVar21 = lVar21 + 1;
  iVar13 = j + -1;
  lVar22 = (long)iVar13;
  if (((pNVar2[lVar21].pair < -1) && (pNVar2[lVar22].pair < -1)) &&
     (0 < (short)pair[this->S_[lVar21]][this->S_[lVar22]])) {
    eVar8 = get_e_stP(this,i,j);
    eVar9 = get_VP(this,iVar12,iVar13);
    local_88 = eVar9 + eVar8;
  }
  local_68 = uVar4;
  if (uVar6 < uVar4) {
    local_68 = uVar6;
  }
  local_64 = i + 0x1f;
  if (j + -4 < i + 0x1f) {
    local_64 = j + -4;
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&local_68;
  iVar14 = std::min<int>(__l);
  uVar19 = (ulong)(uint)~i;
  if ((int)uVar5 < (int)uVar7) {
    uVar5 = uVar7;
  }
  local_58 = (ulong)(uint)(j - i);
  local_40 = (ulong)((j - i) - 0x20);
  lVar23 = (long)iVar14;
  local_50 = lVar22 << 5 | 6;
  iVar14 = 10000000;
  local_48 = lVar23;
  local_38 = uVar19;
  for (; lVar21 < lVar23; lVar21 = lVar21 + 1) {
    if (((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
         super__Vector_impl_data._M_start[lVar21].pair < -1) &&
       (iVar16 = (int)lVar21,
       (int)uVar19 + iVar16 <=
       (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[lVar21 + -1])) {
      local_64 = (int)local_40 + iVar16;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_68;
      local_68 = uVar5 + 1;
      iVar15 = std::max<int>(__l_00);
      iVar20 = 0;
      uVar24 = local_50;
      for (lVar26 = lVar22; uVar19 = local_38, lVar23 = local_48, iVar15 < lVar26;
          lVar26 = lVar26 + -1) {
        if (((*(int *)((long)&((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                               super__Vector_impl_data._M_start)->parent + uVar24 * 2) < -1) &&
            (0 < (short)pair[this->S_[lVar21]][this->S_[lVar26]])) &&
           (iVar20 <= (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar22])) {
          eVar8 = get_e_intP(this,i,iVar16,(cand_pos_t)lVar26,j);
          eVar9 = get_VP(this,iVar16,(cand_pos_t)lVar26);
          if (eVar9 + eVar8 < iVar14) {
            iVar14 = eVar9 + eVar8;
          }
        }
        iVar20 = iVar20 + 1;
        uVar24 = uVar24 - 0x20;
      }
    }
  }
  uVar5 = sparse_tree::b(tree,i,j);
  uVar4 = sparse_tree::Bp(tree,i,j);
  if (uVar4 < uVar5) {
    uVar5 = uVar4;
  }
  iVar20 = sparse_tree::B(tree,i,j);
  iVar16 = sparse_tree::bp(tree,i,j);
  iVar18 = 10000000;
  for (iVar15 = iVar12; iVar3 = bp_penalty, iVar17 = ap_penalty, iVar15 < (int)uVar5;
      iVar15 = iVar15 + 1) {
    eVar8 = get_WIP(this,iVar12,iVar15 + -1);
    eVar9 = get_VP(this,iVar15,iVar13);
    iVar18 = eVar9 + eVar8;
  }
  if (iVar16 < iVar20) {
    iVar16 = iVar20;
  }
  iVar16 = iVar16 + 1;
  iVar15 = iVar16;
  iVar20 = 10000000;
  while (iVar15 < j) {
    eVar8 = get_VP(this,iVar12,iVar15);
    iVar15 = iVar15 + 1;
    eVar9 = get_WIP(this,iVar15,iVar13);
    if (eVar9 + eVar8 < iVar20) {
      iVar20 = eVar9 + eVar8;
    }
  }
  iVar27 = 10000000;
  for (iVar15 = iVar12; iVar15 < (int)uVar5; iVar15 = iVar15 + 1) {
    eVar8 = get_WIP(this,iVar12,iVar15 + -1);
    eVar9 = get_VPR(this,iVar15,iVar13);
    if (eVar9 + eVar8 < iVar27) {
      iVar27 = eVar9 + eVar8;
    }
  }
  iVar15 = 10000000;
  while (iVar16 < j) {
    eVar8 = get_VPL(this,iVar12,iVar16);
    iVar16 = iVar16 + 1;
    eVar9 = get_WIP(this,iVar16,iVar13);
    if (eVar9 + eVar8 < iVar15) {
      iVar15 = eVar9 + eVar8;
    }
  }
  iVar17 = iVar17 + iVar3 * 2;
  iVar13 = (int)local_58;
  local_64 = local_84;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_68;
  local_68 = uVar10;
  local_60 = iVar25;
  uVar5 = std::min<int>(__l_01);
  local_68 = local_88;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_68;
  local_64 = iVar14;
  iVar12 = std::min<int>(__l_02);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_68;
  local_68 = iVar18 + iVar17;
  local_64 = iVar20 + iVar17;
  local_60 = iVar27 + iVar17;
  local_5c = iVar15 + iVar17;
  local_60 = std::min<int>(__l_03);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_68;
  local_68 = uVar5;
  local_64 = iVar12;
  iVar12 = std::min<int>(__l_04);
  (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar13 + iVar1] = iVar12;
  return;
}

Assistant:

void pseudo_loop::compute_VP(cand_pos_t i, cand_pos_t j, sparse_tree &tree){
	cand_pos_t ij = index[i]+j-i;

	const pair_type ptype_closing = pair[S_[i]][S_[j]];	
	
	energy_t m1 = INF, m2 = INF, m3 = INF, m4= INF, m5 = INF, m6 = INF, m7 = INF, m8 = INF, m9 = INF; //different branches
	
	// Borders -- added one to i and j to make it fit current bounds but also subtracted 1 from answer as the tree bounds are shifted as well
	cand_pos_t Bp_ij = tree.Bp(i,j);
	cand_pos_t B_ij = tree.B(i,j);
	cand_pos_t b_ij = tree.b(i,j);
	cand_pos_t bp_ij = tree.bp(i,j);
	
	//branchs:
	// 1) inArc(i) and NOT_inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// need to check the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) < (tree.tree[i].parent->index) && Bp_ij >= 0 && B_ij >= 0 && bp_ij < 0){
		energy_t WI_ipus1_BPminus = get_WI(i+1,Bp_ij - 1) ;
		energy_t WI_Bplus_jminus = get_WI(B_ij + 1,j-1);
		m1 =   WI_ipus1_BPminus + WI_Bplus_jminus;
	}

	// 2) NOT_inArc(i) and inArc(j)
	// WI(i+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if ((tree.tree[i].parent->index) < (tree.tree[j].parent->index) && (tree.tree[j].parent->index) > 0 && b_ij>= 0 && bp_ij >= 0 && Bp_ij < 0){
		energy_t WI_i_plus_b_minus = get_WI(i+1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij + 1,j-1);
		m2 = WI_i_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 3) inArc(i) and inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) > 0 && Bp_ij >= 0 && B_ij >= 0  && b_ij >= 0 && bp_ij>= 0){
		energy_t WI_i_plus_Bp_minus = get_WI(i+1,Bp_ij - 1);
		energy_t WI_B_plus_b_minus = get_WI(B_ij + 1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij +1,j - 1);
		m3 = WI_i_plus_Bp_minus + WI_B_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 4) NOT_paired(i+1) and NOT_paired(j-1) and they can pair together
	// e_stP(i,i+1,j-1,j) + VP(i+1)(j-1)
	pair_type ptype_closingip1jm1 = pair[S_[i+1]][S_[j-1]];
	if((tree.tree[i+1].pair) < -1 && (tree.tree[j-1].pair) < -1 && ptype_closingip1jm1>0){
		m4 = get_e_stP(i,j)+ get_VP(i+1,j-1);
	}

	// 5) NOT_paired(r) and NOT_paired(rp)
	//  VP(i,j) = e_intP(i,ip,jp,j) + VP(ip,jp)
	// Hosna, April 6th, 2007
	// whenever we use get_borders we have to check for the correct values
	cand_pos_t min_borders = std::min((cand_pos_tu) Bp_ij, (cand_pos_tu) b_ij);
	cand_pos_t edge_i = std::min(i+MAXLOOP+1,j-TURN-1);
	min_borders = std::min({min_borders,edge_i});
//		printf("B'(%d,%d) = %d, b(%d,%d) = %d, min_borders = %d\n",i,j,get_Bp(i,j),i,j,get_b(i,j), min_borders);
	for (cand_pos_t k = i+1; k < min_borders; ++k){
		// Hosna: April 20, 2007
		// i and ip and j and jp should be in the same arc
		// also it should be the case that [i+1,ip-1] && [jp+1,j-1] are empty regions

		if (tree.tree[k].pair < -1 && (tree.up[(k)-1] >= ((k)-(i)-1))){
			// Hosna, April 6th, 2007
			// whenever we use get_borders we have to check for the correct values
			cand_pos_t max_borders = std::max(bp_ij,B_ij)+1;
			cand_pos_t edge_j = k+j-i-MAXLOOP-2;
			max_borders = std::max({max_borders,edge_j});
			for (cand_pos_t l = j-1; l > max_borders ; --l){

				pair_type ptype_closingkj = pair[S_[k]][S_[l]];
				if (tree.tree[l].pair < -1 && ptype_closingkj>0 && (tree.up[(j)-1] >= ((j)-(l)-1))){
					// Hosna: April 20, 2007
					// i and ip and j and jp should be in the same arc -- If it's unpaired between them, they have to be
					energy_t tmp = get_e_intP(i,k,l,j) + get_VP(k,l);
					m5 = std::min(m5,tmp);
					
				}
			}
		}
	}

		cand_pos_t min_Bp_j = std::min((cand_pos_tu) tree.b(i,j), (cand_pos_tu) tree.Bp(i,j));
		cand_pos_t max_i_bp = std::max(tree.B(i,j),tree.bp(i,j));

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m6 = get_WIP(i+1,k-1) + get_VP(k,j-1);
		}
		
		m6 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m7 = std::min(m7,get_VP(i+1,k) + get_WIP(k+1,j-1));
		}

		m7 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m8 =  std::min(m8,get_WIP(i+1,k-1) + get_VPR(k,j-1));
		}

		m8 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m9 = std::min(m9,get_VPL(i+1,k) + get_WIP(k+1,j-1));
		}

		m9 += ap_penalty + 2*bp_penalty;

		



	//finding the min energy
	energy_t vp_h = std::min({m1,m2,m3});
	energy_t vp_iloop = std::min({m4,m5});
	energy_t vp_split = std::min({m6,m7,m8,m9});
	energy_t min = std::min({vp_h,vp_iloop,vp_split});

	VP[ij] = min;
	
}